

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pardiso_interface.c
# Opt level: O0

void free_linsys_solver_pardiso(pardiso_solver *s)

{
  c_int *unaff_RBX;
  c_int *in_RDI;
  c_int *unaff_R12;
  c_int *unaff_R13;
  c_int *unaff_R14;
  void **unaff_R15;
  c_float *in_stack_00000030;
  c_int *in_stack_00000038;
  c_int *in_stack_00000040;
  c_int *in_stack_00000048;
  c_int *in_stack_00000050;
  c_int *in_stack_00000058;
  c_float *in_stack_00000068;
  c_float *in_stack_00000070;
  c_int *in_stack_00000078;
  
  if (in_RDI != (c_int *)0x0) {
    in_RDI[0x95] = -1;
    pardiso(unaff_R15,unaff_R14,unaff_R13,unaff_R12,unaff_RBX,in_RDI,in_stack_00000030,
            in_stack_00000038,in_stack_00000040,in_stack_00000048,in_stack_00000050,
            in_stack_00000058,(c_int *)s,in_stack_00000068,in_stack_00000070,in_stack_00000078);
    if (in_RDI[0x96] != 0) {
      printf("ERROR in %s: ","free_linsys_solver_pardiso");
      printf("Error during MKL Pardiso cleanup: %d",in_RDI[0x96] & 0xffffffff);
      printf("\n");
    }
    if (in_RDI[6] != 0) {
      csc_spfree((csc *)0x119789);
    }
    if (in_RDI[7] != 0) {
      free((void *)in_RDI[7]);
    }
    if (in_RDI[8] != 0) {
      free((void *)in_RDI[8]);
    }
    if (in_RDI[9] != 0) {
      free((void *)in_RDI[9]);
    }
    if (in_RDI[10] != 0) {
      free((void *)in_RDI[10]);
    }
    if (in_RDI[0xb] != 0) {
      free((void *)in_RDI[0xb]);
    }
    if (in_RDI[0x9a] != 0) {
      free((void *)in_RDI[0x9a]);
    }
    if (in_RDI[0x9c] != 0) {
      free((void *)in_RDI[0x9c]);
    }
    if (in_RDI[0x9d] != 0) {
      free((void *)in_RDI[0x9d]);
    }
    if (in_RDI[0x9e] != 0) {
      free((void *)in_RDI[0x9e]);
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void free_linsys_solver_pardiso(pardiso_solver *s) {
    if (s) {

        // Free pardiso solver using internal function
        s->phase = PARDISO_CLEANUP;
        pardiso (s->pt, &(s->maxfct), &(s->mnum), &(s->mtype), &(s->phase),
                 &(s->nKKT), &(s->fdum), s->KKT_p, s->KKT_i, &(s->idum), &(s->nrhs),
                 s->iparm, &(s->msglvl), &(s->fdum), &(s->fdum), &(s->error));

      if ( s->error != 0 ){
#ifdef PRINTING
          c_eprint("Error during MKL Pardiso cleanup: %d", (int)s->error);
#endif
      }
        // Check each attribute of the structure and free it if it exists
        if (s->KKT)         csc_spfree(s->KKT);
        if (s->KKT_i)       c_free(s->KKT_i);
        if (s->KKT_p)       c_free(s->KKT_p);
        if (s->bp)          c_free(s->bp);
        if (s->sol)         c_free(s->sol);
        if (s->rho_inv_vec) c_free(s->rho_inv_vec);

        // These are required for matrix updates
        if (s->Pdiag_idx) c_free(s->Pdiag_idx);
        if (s->PtoKKT)    c_free(s->PtoKKT);
        if (s->AtoKKT)    c_free(s->AtoKKT);
        if (s->rhotoKKT)  c_free(s->rhotoKKT);

        c_free(s);

    }
}